

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetInitialValue
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int var_index,double value)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  uint in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  value_type in_XMM0_Qa;
  size_type in_stack_ffffffffffffffd8;
  pointer *__new_size;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     &in_RDI[0x1f].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar1 <= in_ESI) {
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                *)(in_RDI + 0xf));
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)
               ,(size_type)in_XMM0_Qa);
    num_vars((BasicProblem<mp::BasicProblemParams<int>_> *)0x6b886a);
    std::vector<double,_std::allocator<double>_>::resize(in_RDI,in_stack_ffffffffffffffd8);
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                *)(in_RDI + 0xf));
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (size_type)in_XMM0_Qa);
    __new_size = &in_RDI[0x20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    num_vars((BasicProblem<mp::BasicProblemParams<int>_> *)0x6b88bb);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &in_RDI[0x1f].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)(int)in_ESI);
  *pvVar2 = in_XMM0_Qa;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[0x20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)(int)in_ESI);
  *pvVar3 = 1;
  return;
}

Assistant:

void SetInitialValue(int var_index, double value) {
    if (initial_values_.size() <= static_cast<unsigned>(var_index)) {
      initial_values_.reserve(vars_.capacity());
      initial_values_.resize(num_vars());
      iv_set_.reserve(vars_.capacity());
      iv_set_.resize(num_vars());
    }
    initial_values_[var_index] = value;
    iv_set_[var_index] = 1;
  }